

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaParseIncludeOrRedefine
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,int type)

{
  byte *pbVar1;
  _xmlAttr *p_Var2;
  bool bVar3;
  xmlSchemaPtr pxVar4;
  int iVar5;
  int iVar6;
  xmlAttrPtr ownerItem;
  xmlSchemaTypePtr attr;
  xmlChar *pxVar7;
  xmlChar *name;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar8;
  xmlNodePtr extraout_RDX;
  xmlNodePtr pxVar9;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr extraout_RDX_01;
  xmlNodePtr extraout_RDX_02;
  xmlParserErrors xVar10;
  xmlChar **in_R8;
  char *pcVar11;
  char *in_R9;
  xmlSchemaBucketPtr_conflict bucket;
  xmlChar *local_50;
  int local_44;
  xmlSchemaPtr local_40;
  xmlSchemaBucketPtr_conflict local_38;
  
  pxVar8 = (xmlNodePtr)CONCAT44(in_register_0000000c,type);
  local_38 = (xmlSchemaBucketPtr_conflict)0x0;
  local_50 = (xmlChar *)0x0;
  local_40 = schema;
  pxVar9 = node;
  local_44 = type;
  for (p_Var2 = node->properties; p_Var2 != (_xmlAttr *)0x0; p_Var2 = p_Var2->next) {
    if (p_Var2->ns == (xmlNs *)0x0) {
      iVar5 = xmlStrEqual(p_Var2->name,"id");
      pxVar9 = extraout_RDX_01;
      if ((iVar5 == 0) &&
         (iVar5 = xmlStrEqual(p_Var2->name,"schemaLocation"), pxVar9 = extraout_RDX_02, iVar5 == 0))
      goto LAB_001b5bcc;
    }
    else {
      iVar5 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar9 = extraout_RDX;
      if (iVar5 != 0) {
LAB_001b5bcc:
        xmlSchemaPIllegalAttrErr
                  (pctxt,(xmlParserErrors)p_Var2,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar8);
        pxVar9 = extraout_RDX_00;
      }
    }
  }
  xmlSchemaPValAttrID(pctxt,node,(xmlChar *)pxVar9);
  ownerItem = xmlSchemaGetPropNode(node,"schemaLocation");
  if (ownerItem == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (pctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1f9693,pxVar8,(char *)in_R8,
               in_R9);
LAB_001b5c90:
    if (pctxt->err != 0) {
      return pctxt->err;
    }
  }
  else {
    attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
    iVar5 = xmlSchemaPValAttrNode
                      (pctxt,(xmlSchemaBasicItemPtr)ownerItem,(xmlAttrPtr)attr,
                       (xmlSchemaTypePtr)&local_50,in_R8);
    if (iVar5 != 0) goto LAB_001b5c90;
    pxVar7 = xmlNodeGetBase(node->doc,node);
    if (pxVar7 == (xmlChar *)0x0) {
      name = xmlBuildURI(local_50,node->doc->URL);
    }
    else {
      name = xmlBuildURI(local_50,pxVar7);
      (*xmlFree)(pxVar7);
    }
    if (name == (xmlChar *)0x0) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseIncludeOrRedefine",
                 "could not build an URI from the schemaLocation",(xmlChar *)0x0,(xmlChar *)in_R8);
      return -1;
    }
    local_50 = xmlDictLookup(pctxt->dict,name,-1);
    (*xmlFree)(name);
    iVar5 = xmlStrEqual(local_50,pctxt->URL);
    if (iVar5 != 0) {
      if (local_44 == 3) {
        pcVar11 = "The schema document \'%s\' cannot redefine itself.";
        xVar10 = XML_SCHEMAP_SRC_REDEFINE;
      }
      else {
        pcVar11 = "The schema document \'%s\' cannot include itself.";
        xVar10 = XML_SCHEMAP_SRC_INCLUDE;
      }
      xmlSchemaPCustomErrExt
                (pctxt,xVar10,(xmlSchemaBasicItemPtr)0x0,node,pcVar11,local_50,(xmlChar *)0x0,
                 (xmlChar *)0x0);
      goto LAB_001b5c90;
    }
  }
  pxVar9 = node;
  iVar5 = xmlSchemaAddSchemaDoc
                    (pctxt,local_44,local_50,(xmlDocPtr)0x0,(char *)0x0,0,node,
                     pctxt->targetNamespace,(xmlChar *)0x0,&local_38);
  if (iVar5 != 0) {
    return iVar5;
  }
  if ((local_38 == (xmlSchemaBucketPtr_conflict)0x0) || (local_38->doc == (xmlDocPtr)0x0)) {
    if (local_44 == 2) {
      pcVar11 = "Failed to load the document \'%s\' for inclusion";
      iVar5 = 0xbea;
      xVar10 = XML_SCHEMAP_SRC_INCLUDE;
    }
    else {
      pcVar11 = "Failed to load the document \'%s\' for redefinition";
      iVar5 = 0xc09;
      xVar10 = XML_SCHEMAP_SRC_REDEFINE;
    }
    pxVar9 = (xmlNodePtr)0x0;
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,xVar10,node,(xmlSchemaBasicItemPtr)0x0,
                        pcVar11,local_50,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    bVar3 = true;
  }
  else {
    pxVar7 = pctxt->targetNamespace;
    if (local_38->origTargetNamespace == (xmlChar *)0x0) {
      if (pxVar7 != (xmlChar *)0x0) {
        local_38->targetNamespace = pxVar7;
        iVar5 = 0;
        bVar3 = false;
        goto LAB_001b5e83;
      }
    }
    else {
      if (pxVar7 == (xmlChar *)0x0) {
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_INCLUDE,node,
                            (xmlSchemaBasicItemPtr)0x0,
                            "The target namespace of the included/redefined schema \'%s\' has to be absent, since the including/redefining schema has no target namespace"
                            ,local_50,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
LAB_001b625e:
        return pctxt->err;
      }
      iVar5 = xmlStrEqual(local_38->origTargetNamespace,pxVar7);
      if (iVar5 == 0) {
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_SRC_INCLUDE,(xmlSchemaBasicItemPtr)0x0,node,
                   "The target namespace \'%s\' of the included/redefined schema \'%s\' differs from \'%s\' of the including/redefining schema"
                   ,local_38->origTargetNamespace,local_50,pctxt->targetNamespace);
        goto LAB_001b625e;
      }
    }
    bVar3 = true;
    iVar5 = 0;
  }
LAB_001b5e83:
  pxVar4 = local_40;
  if (((local_38 != (xmlSchemaBucketPtr_conflict)0x0) && (local_38->parsed == 0)) &&
     (local_38->doc != (xmlDocPtr)0x0)) {
    if ((bVar3) || (((uint)local_40->flags >> 9 & 1) != 0)) {
      xmlSchemaParseNewDoc(pctxt,local_40,local_38);
    }
    else {
      local_40->flags = local_40->flags | 0x200;
      xmlSchemaParseNewDoc(pctxt,local_40,local_38);
      pbVar1 = (byte *)((long)&pxVar4->flags + 1);
      *pbVar1 = *pbVar1 ^ 2;
    }
  }
  pxVar8 = node->children;
  if (local_44 == 3) {
    pctxt->redefined = local_38;
    pctxt->isRedefine = 1;
    for (; pxVar8 != (xmlNodePtr)0x0; pxVar8 = pxVar8->next) {
      if ((pxVar8->ns == (xmlNs *)0x0) ||
         (((iVar6 = xmlStrEqual(pxVar8->name,"annotation"), iVar6 == 0 ||
           (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) &&
          ((pxVar8->ns == (xmlNs *)0x0 ||
           (((iVar6 = xmlStrEqual(pxVar8->name,"simpleType"), iVar6 == 0 ||
             (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar6 == 0)) &&
            ((pxVar8->ns == (xmlNs *)0x0 ||
             (((iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"complexType"), iVar6 == 0 ||
               (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
               iVar6 == 0)) &&
              ((pxVar8->ns == (xmlNs *)0x0 ||
               (((iVar6 = xmlStrEqual(pxVar8->name,"group"), iVar6 == 0 ||
                 (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                                     ), iVar6 == 0)) &&
                ((pxVar8->ns == (xmlNs *)0x0 ||
                 ((iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"attributeGroup"), iVar6 == 0 ||
                  (iVar6 = xmlStrEqual(pxVar8->ns->href,
                                       (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)))
                 ))))))))))))))))) {
        pctxt->redefined = (xmlSchemaBucketPtr_conflict)0x0;
        pctxt->isRedefine = 0;
        pcVar11 = "(annotation | (simpleType | complexType | group | attributeGroup))*";
        goto LAB_001b6213;
      }
      if ((pxVar8->ns != (xmlNs *)0x0) &&
         (((iVar6 = xmlStrEqual(pxVar8->name,"annotation"), iVar6 == 0 ||
           (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) && (pxVar8->ns != (xmlNs *)0x0)))) {
        iVar6 = xmlStrEqual(pxVar8->name,"simpleType");
        if ((iVar6 == 0) ||
           (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if (pxVar8->ns != (xmlNs *)0x0) {
            iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"complexType");
            if ((iVar6 == 0) ||
               (iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
               iVar6 == 0)) {
              if (pxVar8->ns != (xmlNs *)0x0) {
                iVar6 = xmlStrEqual(pxVar8->name,"group");
                if ((iVar6 == 0) ||
                   (iVar6 = xmlStrEqual(pxVar8->ns->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                {
                  if ((pxVar8->ns != (xmlNs *)0x0) &&
                     ((iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"attributeGroup"), iVar6 != 0 &&
                      (iVar6 = xmlStrEqual(pxVar8->ns->href,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar6 != 0)))) {
                    xmlSchemaParseAttributeGroupDefinition(pctxt,local_40,pxVar8);
                  }
                }
                else {
                  xmlSchemaParseModelGroupDefinition(pctxt,local_40,pxVar8);
                }
              }
            }
            else {
              xmlSchemaParseComplexType(pctxt,local_40,pxVar8,1);
            }
          }
        }
        else {
          xmlSchemaParseSimpleType(pctxt,local_40,pxVar8,1);
        }
      }
    }
    pctxt->redefined = (xmlSchemaBucketPtr_conflict)0x0;
    pctxt->isRedefine = 0;
  }
  else if ((pxVar8 != (xmlNodePtr)0x0) &&
          (((pxVar8->ns == (xmlNs *)0x0 ||
            (iVar6 = xmlStrEqual(pxVar8->name,"annotation"), iVar6 == 0)) ||
           ((iVar6 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
            iVar6 == 0 || (pxVar8 = pxVar8->next, pxVar8 != (xmlNodePtr)0x0)))))) {
    pcVar11 = "(annotation?)";
LAB_001b6213:
    iVar5 = 0xbd9;
    xmlSchemaPContentErr
              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,pxVar8,
               (xmlNodePtr)0x0,pcVar11,(char *)pxVar9);
  }
  return iVar5;
}

Assistant:

static int
xmlSchemaParseIncludeOrRedefine(xmlSchemaParserCtxtPtr pctxt,
				xmlSchemaPtr schema,
				xmlNodePtr node,
				int type)
{
    xmlNodePtr child = NULL;
    const xmlChar *schemaLocation = NULL;
    int res = 0; /* hasRedefinitions = 0 */
    int isChameleon = 0, wasChameleon = 0;
    xmlSchemaBucketPtr bucket = NULL;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (-1);

    /*
    * Parse attributes. Note that the returned schemaLocation will
    * be already converted to an absolute URI.
    */
    res = xmlSchemaParseIncludeOrRedefineAttrs(pctxt, schema,
	node, (xmlChar **) (&schemaLocation), type);
    if (res != 0)
	return(res);
    /*
    * Load and add the schema document.
    */
    res = xmlSchemaAddSchemaDoc(pctxt, type, schemaLocation, NULL,
	NULL, 0, node, pctxt->targetNamespace, NULL, &bucket);
    if (res != 0)
	return(res);
    /*
    * If we get no schema bucket back, then this means that the schema
    * document could not be located or was broken XML or was not
    * a schema document.
    */
    if ((bucket == NULL) || (bucket->doc == NULL)) {
	if (type == XML_SCHEMA_SCHEMA_INCLUDE) {
	    /*
	    * WARNING for <include>:
	    * We will raise an error if the schema cannot be located
	    * for inclusions, since the that was the feedback from the
	    * schema people. I.e. the following spec piece will *not* be
	    * satisfied:
	    * SPEC src-include: "It is not an error for the `actual value` of the
	    * schemaLocation [attribute] to fail to resolve it all, in which
	    * case no corresponding inclusion is performed.
	    * So do we need a warning report here?"
	    */
	    res = XML_SCHEMAP_SRC_INCLUDE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for inclusion",
		schemaLocation, NULL);
	} else {
	    /*
	    * NOTE: This was changed to raise an error even if no redefinitions
	    * are specified.
	    *
	    * SPEC src-redefine (1)
	    * "If there are any element information items among the [children]
	    * other than <annotation> then the `actual value` of the
	    * schemaLocation [attribute] must successfully resolve."
	    * TODO: Ask the WG if a the location has always to resolve
	    * here as well!
	    */
	    res = XML_SCHEMAP_SRC_REDEFINE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for redefinition",
		schemaLocation, NULL);
	}
    } else {
	/*
	* Check targetNamespace sanity before parsing the new schema.
	* TODO: Note that we won't check further content if the
	* targetNamespace was bad.
	*/
	if (bucket->origTargetNamespace != NULL) {
	    /*
	    * SPEC src-include (2.1)
	    * "SII has a targetNamespace [attribute], and its `actual
	    * value` is identical to the `actual value` of the targetNamespace
	    * [attribute] of SII' (which must have such an [attribute])."
	    */
	    if (pctxt->targetNamespace == NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent, since the including/redefining "
		    "schema has no target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    } else if (!xmlStrEqual(bucket->origTargetNamespace,
		pctxt->targetNamespace)) {
		/* TODO: Change error function. */
		xmlSchemaPCustomErrExt(pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    NULL, node,
		    "The target namespace '%s' of the included/redefined "
		    "schema '%s' differs from '%s' of the "
		    "including/redefining schema",
		    bucket->origTargetNamespace, schemaLocation,
		    pctxt->targetNamespace);
		goto exit_error;
	    }
	} else if (pctxt->targetNamespace != NULL) {
	    /*
	    * Chameleons: the original target namespace will
	    * differ from the resulting namespace.
	    */
	    isChameleon = 1;
	    if (bucket->parsed &&
		bucket->origTargetNamespace != NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent or the same as the "
		    "including/redefining schema's target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    }
	    bucket->targetNamespace = pctxt->targetNamespace;
	}
    }
    /*
    * Parse the schema.
    */
    if (bucket && (!bucket->parsed) && (bucket->doc != NULL)) {
	if (isChameleon) {
	    /* TODO: Get rid of this flag on the schema itself. */
	    if ((schema->flags & XML_SCHEMAS_INCLUDING_CONVERT_NS) == 0) {
		schema->flags |= XML_SCHEMAS_INCLUDING_CONVERT_NS;
	    } else
		wasChameleon = 1;
	}
	xmlSchemaParseNewDoc(pctxt, schema, bucket);
	/* Restore chameleon flag. */
	if (isChameleon && (!wasChameleon))
	    schema->flags ^= XML_SCHEMAS_INCLUDING_CONVERT_NS;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	/*
	* Parse (simpleType | complexType | group | attributeGroup))*
	*/
	pctxt->redefined = bucket;
	/*
	* How to proceed if the redefined schema was not located?
	*/
	pctxt->isRedefine = 1;
	while (IS_SCHEMA(child, "annotation") ||
	    IS_SCHEMA(child, "simpleType") ||
	    IS_SCHEMA(child, "complexType") ||
	    IS_SCHEMA(child, "group") ||
	    IS_SCHEMA(child, "attributeGroup")) {
	    if (IS_SCHEMA(child, "annotation")) {
		/*
		* TODO: discard or not?
		*/
	    } else if (IS_SCHEMA(child, "simpleType")) {
		xmlSchemaParseSimpleType(pctxt, schema, child, 1);
	    } else if (IS_SCHEMA(child, "complexType")) {
		xmlSchemaParseComplexType(pctxt, schema, child, 1);
		/* hasRedefinitions = 1; */
	    } else if (IS_SCHEMA(child, "group")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseModelGroupDefinition(pctxt,
		    schema, child);
	    } else if (IS_SCHEMA(child, "attributeGroup")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseAttributeGroupDefinition(pctxt, schema,
		    child);
	    }
	    child = child->next;
	}
	pctxt->redefined = NULL;
	pctxt->isRedefine = 0;
    } else {
	if (IS_SCHEMA(child, "annotation")) {
	    /*
	    * TODO: discard or not?
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	res = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
	if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	    xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation | (simpleType | complexType | group | attributeGroup))*");
	} else {
	     xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation?)");
	}
    }
    return(res);

exit_error:
    return(pctxt->err);
}